

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  _func_int **pp_Var1;
  int iVar2;
  _func_int **pp_Var3;
  long *in_RSI;
  
  (**(code **)(*in_RSI + 0x20))();
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x119));
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if (in_RSI[0x127] != 0) {
      do {
        pp_Var3 = (_func_int **)in_RSI[0x145];
        if (pp_Var3 != (_func_int **)0x0) {
          pp_Var1 = (this->super_DB)._vptr_DB;
          if (pp_Var1 != pp_Var3) {
            if (pp_Var1 == (_func_int **)0x0) {
LAB_0010b602:
              pp_Var3 = (_func_int **)Status::CopyState((char *)pp_Var3);
            }
            else {
              operator_delete__(pp_Var1);
              pp_Var3 = (_func_int **)in_RSI[0x145];
              if (pp_Var3 != (_func_int **)0x0) goto LAB_0010b602;
              pp_Var3 = (_func_int **)0x0;
            }
            (this->super_DB)._vptr_DB = pp_Var3;
          }
          break;
        }
        std::condition_variable::wait((unique_lock *)(in_RSI + 0x11f));
      } while (in_RSI[0x127] != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x119));
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}